

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void DoIt(void)

{
  ValidateFootprint vFP;
  
  vFP.super_Validate.lineno_ = 1;
  vFP.super_Validate.warnings_ = false;
  vFP._vptr_ValidateFootprint = (_func_int **)&PTR_SetPreviousEventID_00104d58;
  vFP.convertToBin_ = false;
  vFP.validationCheck_ = true;
  builtin_strncpy(vFP.eveIDName_,"Event",6);
  builtin_strncpy(vFP.areaperilIDName_,"Areaperil",10);
  vFP.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vFP.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vFP.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vFP.maxIntensityBin_ = 0;
  builtin_strncpy(vFP.super_Validate.fileDescription_,"Footprint",10);
  vFP.super_Validate.MIN_ID_ = vFP.super_Validate.lineno_;
  Validate::SkipHeaderRow(&vFP.super_Validate);
  ValidateFootprint::ReadFootprintFile(&vFP);
  ValidateFootprint::PrintMaximumIntensityBinIndex(&vFP);
  Validate::PrintSuccessMessage(&vFP.super_Validate);
  ValidateFootprint::~ValidateFootprint(&vFP);
  return;
}

Assistant:

void DoIt() {

  ValidateFootprint vFP;
  vFP.SkipHeaderRow();
  vFP.ReadFootprintFile();
  vFP.PrintMaximumIntensityBinIndex();
  vFP.PrintSuccessMessage();

}